

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

ECDHSecret * __thiscall
CKey::ComputeBIP324ECDHSecret
          (ECDHSecret *__return_storage_ptr__,CKey *this,EllSwiftPubKey *their_ellswift,
          EllSwiftPubKey *our_ellswift,bool initiating)

{
  long lVar1;
  array<unsigned_char,_32UL> *seckey32;
  int iVar2;
  EllSwiftPubKey *ell_b64;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  seckey32 = (this->keydata)._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
  if (seckey32 == (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x149,
                  "ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey &, const EllSwiftPubKey &, bool) const"
                 );
  }
  ell_b64 = our_ellswift;
  if (initiating) {
    ell_b64 = their_ellswift;
    their_ellswift = our_ellswift;
  }
  iVar2 = secp256k1_ellswift_xdh
                    (secp256k1_context_sign,__return_storage_ptr__->_M_elems,(uchar *)their_ellswift
                     ,(uchar *)ell_b64,seckey32->_M_elems,(uint)!initiating,
                     ellswift_xdh_hash_function_bip324,(void *)0x0);
  if (iVar2 == 0) {
    __assert_fail("success",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x157,
                  "ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey &, const EllSwiftPubKey &, bool) const"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey& their_ellswift, const EllSwiftPubKey& our_ellswift, bool initiating) const
{
    assert(keydata);

    ECDHSecret output;
    // BIP324 uses the initiator as party A, and the responder as party B. Remap the inputs
    // accordingly:
    bool success = secp256k1_ellswift_xdh(secp256k1_context_sign,
                                          UCharCast(output.data()),
                                          UCharCast(initiating ? our_ellswift.data() : their_ellswift.data()),
                                          UCharCast(initiating ? their_ellswift.data() : our_ellswift.data()),
                                          keydata->data(),
                                          initiating ? 0 : 1,
                                          secp256k1_ellswift_xdh_hash_function_bip324,
                                          nullptr);
    // Should always succeed for valid keys (assert above).
    assert(success);
    return output;
}